

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MessageOperators.cpp
# Opt level: O1

unique_ptr<helics::Message,_std::default_delete<helics::Message>_> __thiscall
helics::MessageTimeOperator::process
          (MessageTimeOperator *this,
          unique_ptr<helics::Message,_std::default_delete<helics::Message>_> *message)

{
  undefined8 uVar1;
  undefined8 *in_RDX;
  
  if (message[3]._M_t.super___uniq_ptr_impl<helics::Message,_std::default_delete<helics::Message>_>.
      _M_t.super__Tuple_impl<0UL,_helics::Message_*,_std::default_delete<helics::Message>_>.
      super__Head_base<0UL,_helics::Message_*,_false>._M_head_impl != (Message *)0x0) {
    uVar1 = (*(code *)message[4]._M_t.
                      super___uniq_ptr_impl<helics::Message,_std::default_delete<helics::Message>_>.
                      _M_t.
                      super__Tuple_impl<0UL,_helics::Message_*,_std::default_delete<helics::Message>_>
                      .super__Head_base<0UL,_helics::Message_*,_false>._M_head_impl)(message + 1);
    *(undefined8 *)*in_RDX = uVar1;
  }
  (this->super_FilterOperator)._vptr_FilterOperator = (_func_int **)*in_RDX;
  *in_RDX = 0;
  return (__uniq_ptr_data<helics::Message,_std::default_delete<helics::Message>,_true,_true>)
         (__uniq_ptr_data<helics::Message,_std::default_delete<helics::Message>,_true,_true>)this;
}

Assistant:

std::unique_ptr<Message> MessageTimeOperator::process(std::unique_ptr<Message> message)
{
    if (TimeFunction) {
        message->time = TimeFunction(message->time);
    }
    return message;
}